

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

bool __thiscall Rml::DataInterpreter::Run(DataInterpreter *this)

{
  Program *pPVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  pointer pIVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  size_t next_instruction;
  String program_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  String local_50;
  
  bVar5 = true;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  do {
    pPVar1 = this->program;
    if ((undefined1 *)
        (((long)(pPVar1->
                super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pPVar1->
                super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
                _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <= paVar8)
    goto LAB_001f4f85;
    local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar8->_M_local_buf + 1);
    pIVar6 = (pPVar1->
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
             _M_impl.super__Vector_impl_data._M_start + (long)paVar8;
    bVar4 = Execute(this,pIVar6->instruction,&pIVar6->data,(size_t *)&local_b8);
    paVar8 = local_b8;
  } while (bVar4);
  bVar5 = false;
LAB_001f4f85:
  if (bVar5) {
    pVVar2 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar2 != pVVar3) {
      Log::Message(LT_WARNING,
                   "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero)."
                   ,((long)pVVar3 - (long)pVVar2 >> 3) * -0x3333333333333333);
    }
  }
  else {
    pPVar1 = this->program;
    local_90 = &local_80;
    local_88 = 0;
    local_80 = 0;
    pIVar6 = (pPVar1->
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((pPVar1->super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
        _M_impl.super__Vector_impl_data._M_finish != pIVar6) {
      paVar8 = &local_70.field_2;
      local_98 = &local_a8;
      lVar7 = 8;
      uVar9 = 0;
      do {
        local_70._M_string_length = 0;
        local_70.field_2._M_allocated_capacity._0_4_ =
             local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_70._M_dataplus._M_p = (pointer)paVar8;
        Variant::
        GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((Variant *)((pIVar6->data).data + lVar7 + -0x10),&local_70);
        local_b8 = &local_a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar8) {
          local_a8._8_4_ = local_70.field_2._8_4_;
          local_a8._12_4_ = local_70.field_2._12_4_;
        }
        else {
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_70._M_dataplus._M_p;
        }
        local_a8._M_allocated_capacity._4_4_ = local_70.field_2._M_allocated_capacity._4_4_;
        local_a8._M_allocated_capacity._0_4_ = local_70.field_2._M_allocated_capacity._0_4_;
        local_b0 = local_70._M_string_length;
        local_70._M_string_length = 0;
        local_70.field_2._M_allocated_capacity._0_4_ =
             local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_70._M_dataplus._M_p = (pointer)paVar8;
        CreateString_abi_cxx11_
                  (&local_50,"  %4zu  \'%c\'  %s\n",uVar9,
                   (ulong)(uint)(int)(((pPVar1->
                                       super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->data).data
                                     [lVar7 + 0xffffffffffffffe8],local_b8);
        ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
        }
        uVar9 = uVar9 + 1;
        pIVar6 = (pPVar1->
                 super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x30;
      } while (uVar9 < (ulong)(((long)(pPVar1->
                                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar6 >>
                               4) * -0x5555555555555555));
    }
    Log::Message(LT_WARNING,"Failed to execute program with %zu instructions:",
                 ((long)(this->program->
                        super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->program->
                        super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
    Log::Message(LT_WARNING,"%s",local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool Run()
	{
		bool success = true;
		size_t i = 0;
		while (i < program.size())
		{
			size_t next_instruction = i + 1;
			if (!Execute(program[i].instruction, program[i].data, next_instruction))
			{
				success = false;
				break;
			}
			i = next_instruction;
		}

		if (success && !stack.empty())
			Log::Message(Log::LT_WARNING, "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero).",
				stack.size());

		if (!success)
		{
			String program_str = DumpProgram(program);
			Log::Message(Log::LT_WARNING, "Failed to execute program with %zu instructions:", program.size());
			Log::Message(Log::LT_WARNING, "%s", program_str.c_str());
		}

		return success;
	}